

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O3

char * benchmark::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char *pcVar6;
  string flag_str;
  allocator local_89;
  char *local_88;
  size_t local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    return (char *)0x0;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"--","");
  std::__cxx11::string::string((string *)&local_68,flag,&local_89);
  uVar5 = 0xf;
  if (local_48 != local_38) {
    uVar5 = local_38[0];
  }
  if (uVar5 < (ulong)(local_60 + local_40)) {
    uVar5 = 0xf;
    if (local_68 != local_58) {
      uVar5 = local_58[0];
    }
    if ((ulong)(local_60 + local_40) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_0010ba20;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_0010ba20:
  local_88 = (char *)&local_78;
  pcVar1 = (char *)(puVar4 + 2);
  if ((char *)*puVar4 == pcVar1) {
    local_78 = *(undefined8 *)pcVar1;
    uStack_70 = puVar4[3];
  }
  else {
    local_78 = *(undefined8 *)pcVar1;
    local_88 = (char *)*puVar4;
  }
  local_80 = puVar4[1];
  *puVar4 = pcVar1;
  puVar4[1] = 0;
  *pcVar1 = '\0';
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  sVar2 = local_80;
  pcVar1 = local_88;
  iVar3 = strncmp(str,local_88,local_80);
  if (iVar3 == 0) {
    pcVar6 = str + sVar2;
    if (((!def_optional) || (str[sVar2] != '\0')) && (pcVar6 = pcVar6 + 1, str[sVar2] != '=')) {
      pcVar6 = (char *)0x0;
    }
  }
  else {
    pcVar6 = (char *)0x0;
  }
  if (pcVar1 != (char *)&local_78) {
    operator_delete(pcVar1);
  }
  return pcVar6;
}

Assistant:

const char* ParseFlagValue(const char* str, const char* flag,
                           bool def_optional) {
  // str and flag must not be nullptr.
  if (str == nullptr || flag == nullptr) return nullptr;

  // The flag must start with "--".
  const std::string flag_str = std::string("--") + std::string(flag);
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) return flag_end;

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}